

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_gear_feed(ldmRollingHashState_t *state,BYTE *data,size_t size,size_t *splits,
                         uint *numSplits)

{
  ulong uVar1;
  size_t sVar2;
  U64 mask;
  U64 hash;
  size_t n;
  uint *numSplits_local;
  size_t *splits_local;
  size_t size_local;
  BYTE *data_local;
  ldmRollingHashState_t *state_local;
  
  mask = state->rolling;
  uVar1 = state->stopMask;
  hash = 0;
  do {
    do {
      if (size <= hash + 3) goto LAB_00ff8170;
      mask = mask * 2 + ZSTD_ldm_gearTab[(int)(uint)data[hash]];
      sVar2 = hash + 1;
      if ((mask & uVar1) == 0) {
        splits[*numSplits] = sVar2;
        *numSplits = *numSplits + 1;
        if (*numSplits == 0x40) goto LAB_00ff8206;
      }
      mask = mask * 2 + ZSTD_ldm_gearTab[(int)(uint)data[sVar2]];
      sVar2 = hash + 2;
      if ((mask & uVar1) == 0) {
        splits[*numSplits] = sVar2;
        *numSplits = *numSplits + 1;
        if (*numSplits == 0x40) goto LAB_00ff8206;
      }
      mask = mask * 2 + ZSTD_ldm_gearTab[(int)(uint)data[sVar2]];
      sVar2 = hash + 3;
      if ((mask & uVar1) == 0) {
        splits[*numSplits] = sVar2;
        *numSplits = *numSplits + 1;
        if (*numSplits == 0x40) goto LAB_00ff8206;
      }
      mask = mask * 2 + ZSTD_ldm_gearTab[(int)(uint)data[sVar2]];
      hash = hash + 4;
    } while ((mask & uVar1) != 0);
    splits[*numSplits] = hash;
    *numSplits = *numSplits + 1;
    sVar2 = hash;
  } while (*numSplits != 0x40);
  goto LAB_00ff8206;
  while( true ) {
    splits[*numSplits] = hash;
    *numSplits = *numSplits + 1;
    sVar2 = hash;
    if (*numSplits == 0x40) break;
LAB_00ff8170:
    do {
      sVar2 = hash;
      if (size <= hash) goto LAB_00ff8206;
      mask = mask * 2 + ZSTD_ldm_gearTab[(int)(uint)data[hash]];
      hash = hash + 1;
    } while ((mask & uVar1) != 0);
  }
LAB_00ff8206:
  hash = sVar2;
  state->rolling = mask;
  return hash;
}

Assistant:

static size_t ZSTD_ldm_gear_feed(ldmRollingHashState_t* state,
                                 BYTE const* data, size_t size,
                                 size_t* splits, unsigned* numSplits)
{
    size_t n;
    U64 hash, mask;

    hash = state->rolling;
    mask = state->stopMask;
    n = 0;

#define GEAR_ITER_ONCE() do { \
        hash = (hash << 1) + ZSTD_ldm_gearTab[data[n] & 0xff]; \
        n += 1; \
        if (UNLIKELY((hash & mask) == 0)) { \
            splits[*numSplits] = n; \
            *numSplits += 1; \
            if (*numSplits == LDM_BATCH_SIZE) \
                goto done; \
        } \
    } while (0)

    while (n + 3 < size) {
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
    }
    while (n < size) {
        GEAR_ITER_ONCE();
    }

#undef GEAR_ITER_ONCE

done:
    state->rolling = hash;
    return n;
}